

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::EndColumns(void)

{
  int *piVar1;
  undefined8 *puVar2;
  float fVar3;
  ImGuiWindow *pIVar4;
  ImGuiWindow *pIVar5;
  ImGuiColumnData *pIVar6;
  undefined8 uVar7;
  ImGuiContext *pIVar8;
  bool bVar9;
  uint uVar10;
  ImU32 col;
  ImGuiColumnData *__dest;
  ImGuiContext *g;
  int iVar11;
  ImGuiID id;
  ulong uVar12;
  uint uVar13;
  float fVar14;
  float fVar15;
  undefined4 extraout_XMM0_Db;
  uint extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  uint extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  uint extraout_XMM0_Dd_00;
  bool held;
  bool hovered;
  ImGuiID column_id;
  ImRect column_rect;
  bool local_a2;
  bool local_a1;
  ulong local_a0;
  undefined1 local_98 [16];
  float local_84;
  float local_80;
  ImGuiID local_7c;
  ImVec4 local_78;
  ImVec2 local_60;
  ImRect local_58;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  pIVar8 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  pIVar4->Accessed = true;
  if ((pIVar4->DC).ColumnsCount < 2) {
    __assert_fail("window->DC.ColumnsCount > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui.cpp"
                  ,0x27e3,"void ImGui::EndColumns()");
  }
  PopItemWidth();
  PopClipRect();
  ImDrawList::ChannelsMerge(pIVar4->DrawList);
  fVar14 = (pIVar4->DC).ColumnsCellMaxY;
  fVar15 = (pIVar4->DC).CursorPos.y;
  fVar3 = (pIVar4->DC).ColumnsMaxX;
  uVar13 = -(uint)(fVar15 <= fVar14);
  local_48 = (float)(~uVar13 & (uint)fVar15 | (uint)fVar14 & uVar13);
  (pIVar4->DC).ColumnsCellMaxY = local_48;
  uStack_44 = 0;
  uStack_40 = 0;
  uStack_3c = 0;
  (pIVar4->DC).CursorPos.y = local_48;
  fVar14 = (pIVar4->DC).ColumnsStartMaxPosX;
  uVar13 = -(uint)(fVar3 <= fVar14);
  (pIVar4->DC).CursorMaxPos.x = (float)(~uVar13 & (uint)fVar3 | (uint)fVar14 & uVar13);
  if ((((pIVar4->DC).ColumnsFlags & 1) == 0) && (pIVar4->SkipItems == false)) {
    local_a0 = 0xffffffff;
    if (1 < (pIVar4->DC).ColumnsCount) {
      local_80 = (pIVar4->DC).ColumnsStartPosY;
      local_84 = local_80 + 1.0;
      uVar13 = 1;
      local_a0 = 0xffffffff;
      do {
        local_98._0_4_ = (pIVar4->Pos).x;
        fVar14 = GetColumnOffset(uVar13);
        local_98._0_4_ = fVar14 + (float)local_98._0_4_;
        id = (pIVar4->DC).ColumnsSetId + uVar13;
        local_58.Min.x = (float)local_98._0_4_ + -4.0;
        local_98._4_4_ = extraout_XMM0_Db;
        local_98._8_4_ = extraout_XMM0_Dc;
        local_98._12_4_ = extraout_XMM0_Dd;
        local_58.Max.x = (float)local_98._0_4_ + 4.0;
        local_58.Min.y = local_80;
        local_58.Max.y = local_48;
        local_7c = id;
        bVar9 = IsClippedEx(&local_58,&local_7c,false);
        if (!bVar9) {
          local_a1 = false;
          local_a2 = false;
          if (((pIVar4->DC).ColumnsFlags & 2) == 0) {
            ButtonBehavior(&local_58,id,&local_a1,&local_a2,0);
            if ((local_a1 != false) || (local_a2 == true)) {
              pIVar8->MouseCursor = 4;
            }
            if ((local_a2 == true) &&
               (local_a0 = (ulong)uVar13, pIVar8->ActiveIdIsJustActivated == true)) {
              (pIVar8->ActiveIdClickOffset).x = (pIVar8->ActiveIdClickOffset).x + -4.0;
              local_a0 = (ulong)uVar13;
            }
          }
          uVar10 = local_a1 & 1 | 0x1c;
          if (local_a2 != false) {
            uVar10 = 0x1e;
          }
          puVar2 = (undefined8 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uVar10 << 4));
          local_78._0_8_ = *puVar2;
          uVar7 = puVar2[1];
          local_78.w = (float)((ulong)uVar7 >> 0x20);
          local_78.z = (float)uVar7;
          local_78.w = (GImGui->Style).Alpha * local_78.w;
          col = ColorConvertFloat4ToU32(&local_78);
          local_60.x = (float)(int)(float)local_98._0_4_;
          local_78.y = local_84;
          local_78.x = local_60.x;
          local_60.y = local_48;
          ImDrawList::AddLine(pIVar4->DrawList,(ImVec2 *)&local_78,&local_60,col,1.0);
        }
        uVar13 = uVar13 + 1;
      } while ((int)uVar13 < (pIVar4->DC).ColumnsCount);
    }
    pIVar8 = GImGui;
    iVar11 = (int)local_a0;
    if (iVar11 != -1) {
      if (iVar11 < 1) {
        __assert_fail("column_index > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui.cpp"
                      ,0x2753,"float GetDraggedColumnOffset(int)");
      }
      pIVar5 = GImGui->CurrentWindow;
      if (GImGui->ActiveId != (pIVar5->DC).ColumnsSetId + iVar11) {
        __assert_fail("g.ActiveId == window->DC.ColumnsSetId + ImGuiID(column_index)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui.cpp"
                      ,0x2754,"float GetDraggedColumnOffset(int)");
      }
      local_98 = ZEXT416((uint)(((GImGui->IO).MousePos.x - (GImGui->ActiveIdClickOffset).x) -
                               (pIVar5->Pos).x));
      fVar14 = GetColumnOffset(iVar11 + -1);
      fVar14 = fVar14 + (pIVar8->Style).ColumnsMinSpacing;
      uVar13 = -(uint)(fVar14 <= (float)local_98._0_4_);
      fVar14 = (float)(~uVar13 & (uint)fVar14 | local_98._0_4_ & uVar13);
      if (((pIVar5->DC).ColumnsFlags & 4) != 0) {
        local_98._4_4_ = local_98._4_4_ & extraout_XMM0_Db_00;
        local_98._0_4_ = fVar14;
        local_98._8_4_ = local_98._8_4_ & extraout_XMM0_Dc_00;
        local_98._12_4_ = local_98._12_4_ & extraout_XMM0_Dd_00;
        fVar15 = GetColumnOffset(iVar11 + 1);
        fVar15 = fVar15 - (pIVar8->Style).ColumnsMinSpacing;
        fVar14 = (float)local_98._0_4_;
        if (fVar15 <= (float)local_98._0_4_) {
          fVar14 = fVar15;
        }
      }
      SetColumnOffset(iVar11,fVar14);
    }
  }
  (pIVar4->DC).ColumnsCurrent = 0;
  (pIVar4->DC).ColumnsCount = 1;
  (pIVar4->DC).ColumnsFlags = 0;
  pIVar8 = GImGui;
  (pIVar4->DC).ColumnsSetId = 0;
  iVar11 = (pIVar4->DC).ColumnsData.Capacity;
  if (iVar11 < 0) {
    uVar13 = iVar11 / 2 + iVar11;
    uVar12 = 0;
    if (0 < (int)uVar13) {
      uVar12 = (ulong)uVar13;
    }
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + 1;
    __dest = (ImGuiColumnData *)(*(pIVar8->IO).MemAllocFn)(uVar12 * 0x14);
    pIVar6 = (pIVar4->DC).ColumnsData.Data;
    if (pIVar6 != (ImGuiColumnData *)0x0) {
      memcpy(__dest,pIVar6,(long)(pIVar4->DC).ColumnsData.Size * 0x14);
    }
    pIVar6 = (pIVar4->DC).ColumnsData.Data;
    if (pIVar6 != (ImGuiColumnData *)0x0) {
      piVar1 = &(GImGui->IO).MetricsAllocs;
      *piVar1 = *piVar1 + -1;
    }
    (*(GImGui->IO).MemFreeFn)(pIVar6);
    (pIVar4->DC).ColumnsData.Data = __dest;
    (pIVar4->DC).ColumnsData.Capacity = (int)uVar12;
  }
  (pIVar4->DC).ColumnsData.Size = 0;
  (pIVar4->DC).ColumnsOffsetX = 0.0;
  (pIVar4->DC).CursorPos.x = (float)(int)((pIVar4->Pos).x + (pIVar4->DC).IndentX + 0.0);
  return;
}

Assistant:

void ImGui::EndColumns()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    IM_ASSERT(window->DC.ColumnsCount > 1);

    PopItemWidth();
    PopClipRect();
    window->DrawList->ChannelsMerge();

    window->DC.ColumnsCellMaxY = ImMax(window->DC.ColumnsCellMaxY, window->DC.CursorPos.y);
    window->DC.CursorPos.y = window->DC.ColumnsCellMaxY;
    window->DC.CursorMaxPos.x = ImMax(window->DC.ColumnsStartMaxPosX, window->DC.ColumnsMaxX);  // Columns don't grow parent

    // Draw columns borders and handle resize
    if (!(window->DC.ColumnsFlags & ImGuiColumnsFlags_NoBorder) && !window->SkipItems)
    {
        const float y1 = window->DC.ColumnsStartPosY;
        const float y2 = window->DC.CursorPos.y;
        int dragging_column = -1;
        for (int i = 1; i < window->DC.ColumnsCount; i++)
        {
            float x = window->Pos.x + GetColumnOffset(i);
            const ImGuiID column_id = window->DC.ColumnsSetId + ImGuiID(i);
            const float column_w = 4.0f; // Width for interaction
            const ImRect column_rect(ImVec2(x - column_w, y1), ImVec2(x + column_w, y2));
            if (IsClippedEx(column_rect, &column_id, false))
                continue;
            
            bool hovered = false, held = false;
            if (!(window->DC.ColumnsFlags & ImGuiColumnsFlags_NoResize))
            {
                ButtonBehavior(column_rect, column_id, &hovered, &held);
                if (hovered || held)
                    g.MouseCursor = ImGuiMouseCursor_ResizeEW;
                if (held && g.ActiveIdIsJustActivated)
                    g.ActiveIdClickOffset.x -= column_w; // Store from center of column line (we used a 8 wide rect for columns clicking). This is used by GetDraggedColumnOffset().
                if (held)
                    dragging_column = i;
            }

            // Draw column
            const ImU32 col = GetColorU32(held ? ImGuiCol_SeparatorActive : hovered ? ImGuiCol_SeparatorHovered : ImGuiCol_Separator);
            const float xi = (float)(int)x;
            window->DrawList->AddLine(ImVec2(xi, y1 + 1.0f), ImVec2(xi, y2), col);
        }

        // Apply dragging after drawing the column lines, so our rendered lines are in sync with how items were displayed during the frame.
        if (dragging_column != -1)
        {
            float x = GetDraggedColumnOffset(dragging_column);
            SetColumnOffset(dragging_column, x);
        }
    }

    window->DC.ColumnsSetId = 0;
    window->DC.ColumnsCurrent = 0;
    window->DC.ColumnsCount = 1;
    window->DC.ColumnsFlags = 0;
    window->DC.ColumnsData.resize(0);
    window->DC.ColumnsOffsetX = 0.0f;
    window->DC.CursorPos.x = (float)(int)(window->Pos.x + window->DC.IndentX + window->DC.ColumnsOffsetX);
}